

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintexteditsearchwidget.cpp
# Opt level: O0

void __thiscall
QPlainTextEditSearchWidget::searchLineEditTextChanged
          (QPlainTextEditSearchWidget *this,QString *arg1)

{
  bool bVar1;
  int iVar2;
  QString *arg1_local;
  QPlainTextEditSearchWidget *this_local;
  
  QString::operator=((QString *)(this + 0x70),(QString *)arg1);
  iVar2 = QTimer::interval();
  if ((iVar2 != 0) && (bVar1 = QString::isEmpty((QString *)(this + 0x70)), !bVar1)) {
    QTimer::start();
    QWidget::setEnabled(SUB81(*(undefined8 *)(*(long *)(this + 0x28) + 0x48),0));
    QWidget::setEnabled(SUB81(*(undefined8 *)(*(long *)(this + 0x28) + 0x28),0));
    return;
  }
  performSearch(this);
  return;
}

Assistant:

void QPlainTextEditSearchWidget::searchLineEditTextChanged(
    const QString &arg1) {
    _searchTerm = arg1;

    if (_debounceTimer.interval() != 0 && !_searchTerm.isEmpty()) {
        _debounceTimer.start();
        ui->searchDownButton->setEnabled(false);
        ui->searchUpButton->setEnabled(false);
    } else {
        performSearch();
    }
}